

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O0

void Diligent::ValidateBufferDesc(BufferDesc *Desc,IRenderDevice *pDevice)

{
  long lVar1;
  CPU_ACCESS_FLAGS CVar2;
  MISC_BUFFER_FLAGS MVar3;
  DRAW_COMMAND_CAP_FLAGS DVar4;
  int iVar5;
  BIND_FLAGS BVar6;
  SPARSE_RESOURCE_CAP_FLAGS SVar7;
  BIND_FLAGS BVar8;
  Uint32 UVar9;
  undefined4 extraout_var;
  long lVar10;
  Char *Message;
  char *in_RCX;
  char *Delimiter;
  _func_int **local_288;
  _func_int **local_280;
  _func_int **local_278;
  bool local_269;
  _func_int **local_250;
  _func_int **local_240;
  _func_int **local_238;
  _func_int **local_230;
  _func_int **local_228;
  _func_int **local_220;
  SparseResourceProperties *local_218;
  _func_int **local_210;
  _func_int **local_208;
  _func_int **local_200;
  _func_int **local_1f8;
  _func_int **local_1f0;
  _func_int **local_1e8;
  _func_int **local_1e0;
  _func_int **local_1d0;
  _func_int **local_1c8;
  _func_int **local_1c0;
  _func_int **local_1b8;
  _func_int **local_1b0;
  _func_int **local_1a0;
  _func_int **local_198;
  _func_int **local_190;
  _func_int **local_188;
  bool local_179;
  undefined1 local_178 [7];
  bool NeedsBackingResource;
  string msg;
  String local_150;
  _func_int **local_130;
  _func_int **local_128;
  _func_int **local_120;
  _func_int **local_118;
  _func_int **local_110;
  _func_int **local_108;
  char *local_100;
  SparseResourceProperties *SparseRes;
  _func_int **local_f0;
  _func_int **local_e8;
  _func_int **local_e0;
  _func_int **local_d8;
  _func_int **local_d0;
  _func_int **local_c8;
  _func_int **local_c0;
  _func_int **local_b8;
  _func_int **local_b0;
  _func_int **local_a8;
  _func_int **local_a0;
  Char *local_98;
  _func_int **local_90 [3];
  char local_71;
  String local_70;
  _func_int **local_50;
  undefined4 local_44;
  long lStack_40;
  Uint32 AllowedBindFlags;
  DeviceFeatures *Features;
  AdapterMemoryInfo *MemoryInfo;
  IRenderDevice *pDevice_local;
  BufferDesc *Desc_local;
  
  MemoryInfo = (AdapterMemoryInfo *)pDevice;
  pDevice_local = (IRenderDevice *)Desc;
  iVar5 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
  Features = (DeviceFeatures *)(CONCAT44(extraout_var,iVar5) + 0x90);
  lStack_40 = (**(code **)(MemoryInfo->LocalMemory + 0xc0))();
  lStack_40 = lStack_40 + 0xc;
  local_44 = 0x59f;
  if (((ulong)pDevice_local[2].super_IObject._vptr_IObject & 0xfffffa60) != 0) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_1a0 = (_func_int **)0xe30c4c;
    }
    else {
      local_1a0 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_50 = local_1a0;
    GetBindFlagsString_abi_cxx11_
              (&local_70,
               (Diligent *)
               (ulong)(*(uint *)&pDevice_local[2].super_IObject._vptr_IObject & 0xfffffa60),0xf64f1c
               ,in_RCX);
    local_71 = '.';
    LogError<true,char[24],char_const*,char[15],char[56],std::__cxx11::string,char>
              (false,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0x3f,(char (*) [24])"Description of buffer \'",(char **)&local_50,
               (char (*) [15])"\' is invalid: ",
               (char (*) [56])"the following bind flags are not allowed for a buffer: ",&local_70,
               &local_71);
    std::__cxx11::string::~string((string *)&local_70);
  }
  BVar6 = operator&(*(BIND_FLAGS *)&pDevice_local[2].super_IObject._vptr_IObject,
                    BIND_UNORDERED_ACCESS);
  if ((BVar6 != BIND_NONE) ||
     (BVar6 = operator&(*(BIND_FLAGS *)&pDevice_local[2].super_IObject._vptr_IObject,
                        BIND_SHADER_RESOURCE), BVar6 != BIND_NONE)) {
    if ((*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 6) == '\0') ||
       (3 < *(byte *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 6))) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_1b0 = (_func_int **)0xe30c4c;
      }
      else {
        local_1b0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_90[0] = local_1b0;
      local_98 = GetBufferModeString(*(BUFFER_MODE *)
                                      ((long)&pDevice_local[2].super_IObject._vptr_IObject + 6));
      LogError<true,char[24],char_const*,char[15],char_const*,char[100]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x44,(char (*) [24])"Description of buffer \'",(char **)local_90,
                 (char (*) [15])"\' is invalid: ",&local_98,
                 (char (*) [100])
                 " is not a valid mode for a buffer created with BIND_SHADER_RESOURCE or BIND_UNORDERED_ACCESS flags."
                );
    }
    if ((*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 6) == '\x01') &&
       (*(char *)(lStack_40 + 0x2e) == '\0')) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_1b8 = (_func_int **)0xe30c4c;
      }
      else {
        local_1b8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_a0 = local_1b8;
      LogError<true,char[24],char_const*,char[15],char[90]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x46,(char (*) [24])"Description of buffer \'",(char **)&local_a0,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [90])
                 "the device does not support formatted buffers. Check the FormattedBuffers device feature."
                );
    }
    if (((*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 6) == '\x02') ||
        (*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 6) == '\x01')) &&
       (*(int *)&pDevice_local[3].super_IObject._vptr_IObject == 0)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_1c0 = (_func_int **)0xe30c4c;
      }
      else {
        local_1c0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_a8 = local_1c0;
      LogError<true,char[24],char_const*,char[15],char[70]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x4a,(char (*) [24])"Description of buffer \'",(char **)&local_a8,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [70])
                 "element stride must not be zero for structured and formatted buffers.");
    }
  }
  BVar6 = operator&(*(BIND_FLAGS *)&pDevice_local[2].super_IObject._vptr_IObject,BIND_RAY_TRACING);
  if ((BVar6 != BIND_NONE) && (*(char *)(lStack_40 + 8) == '\0')) {
    if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
      local_1c8 = (_func_int **)0xe30c4c;
    }
    else {
      local_1c8 = (pDevice_local->super_IObject)._vptr_IObject;
    }
    local_b0 = local_1c8;
    LogError<true,char[24],char_const*,char[15],char[76]>
              (false,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0x53,(char (*) [24])"Description of buffer \'",(char **)&local_b0,
               (char (*) [15])"\' is invalid: ",
               (char (*) [76])
               "BIND_RAY_TRACING flag can\'t be used when RayTracing feature is not enabled.");
  }
  BVar6 = operator&(*(BIND_FLAGS *)&pDevice_local[2].super_IObject._vptr_IObject,
                    BIND_INDIRECT_DRAW_ARGS);
  if (BVar6 != BIND_NONE) {
    lVar10 = (**(code **)(MemoryInfo->LocalMemory + 200))();
    DVar4 = operator&(*(DRAW_COMMAND_CAP_FLAGS *)(lVar10 + 0x194),
                      DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT);
    if (DVar4 == DRAW_COMMAND_CAP_FLAG_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_1d0 = (_func_int **)0xe30c4c;
      }
      else {
        local_1d0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_b8 = local_1d0;
      LogError<true,char[24],char_const*,char[15],char[112]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x58,(char (*) [24])"Description of buffer \'",(char **)&local_b8,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [112])
                 "BIND_INDIRECT_DRAW_ARGS flag can\'t be used when DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT capability is not supported"
                );
    }
  }
  switch(*(undefined1 *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 4)) {
  case 0:
  case 1:
    if (*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 5) != '\0') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_1e0 = (_func_int **)0xe30c4c;
      }
      else {
        local_1e0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_c0 = local_1e0;
      LogError<true,char[24],char_const*,char[15],char[64]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x5f,(char (*) [24])"Description of buffer \'",(char **)&local_c0,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [64])"static and default buffers can\'t have any CPU access flags set.");
    }
    break;
  case 2:
    if (*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 5) != '\x02') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_1e8 = (_func_int **)0xe30c4c;
      }
      else {
        local_1e8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_c8 = local_1e8;
      LogError<true,char[24],char_const*,char[15],char[47]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,99,(char (*) [24])"Description of buffer \'",(char **)&local_c8,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [47])"dynamic buffers require CPU_ACCESS_WRITE flag.");
    }
    break;
  case 3:
    if ((*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 5) != '\x02') &&
       (*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 5) != '\x01')) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_1f0 = (_func_int **)0xe30c4c;
      }
      else {
        local_1f0 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_d0 = local_1f0;
      LogError<true,char[24],char_const*,char[15],char[97]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x68,(char (*) [24])"Description of buffer \'",(char **)&local_d0,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [97])
                 "exactly one of CPU_ACCESS_WRITE or CPU_ACCESS_READ flags must be specified for a staging buffer."
                );
    }
    if (*(int *)&pDevice_local[2].super_IObject._vptr_IObject != 0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_1f8 = (_func_int **)0xe30c4c;
      }
      else {
        local_1f8 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_d8 = local_1f8;
      LogError<true,char[24],char_const*,char[15],char[104]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x6a,(char (*) [24])"Description of buffer \'",(char **)&local_d8,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [104])
                 "staging buffers cannot be bound to any part of the graphics pipeline and can\'t have any bind flags set."
                );
    }
    break;
  case 4:
    lVar10._0_1_ = Features->DepthClamp;
    lVar10._1_1_ = Features->IndependentBlend;
    lVar10._2_1_ = Features->DualSourceBlend;
    lVar10._3_1_ = Features->MultiViewport;
    lVar10._4_1_ = Features->TextureCompressionBC;
    lVar10._5_1_ = Features->TextureCompressionETC2;
    lVar10._6_1_ = Features->VertexPipelineUAVWritesAndAtomics;
    lVar10._7_1_ = Features->PixelUAVWritesAndAtomics;
    if (lVar10 == 0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_200 = (_func_int **)0xe30c4c;
      }
      else {
        local_200 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_e0 = local_200;
      LogError<true,char[24],char_const*,char[15],char[143]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x70,(char (*) [24])"Description of buffer \'",(char **)&local_e0,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [143])
                 "Unified memory is not present on this device. Check the amount of available unified memory in the device caps before creating unified buffers."
                );
    }
    if (*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 5) == '\0') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_208 = (_func_int **)0xe30c4c;
      }
      else {
        local_208 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_e8 = local_208;
      LogError<true,char[24],char_const*,char[15],char[98]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x72,(char (*) [24])"Description of buffer \'",(char **)&local_e8,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [98])
                 "at least one of CPU_ACCESS_WRITE or CPU_ACCESS_READ flags must be specified for a unified buffer."
                );
    }
    CVar2 = operator&(*(CPU_ACCESS_FLAGS *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 5)
                      ,CPU_ACCESS_FLAG_LAST);
    if ((CVar2 != CPU_ACCESS_NONE) &&
       (CVar2 = operator&(Features->ShaderResourceStaticArrays,CPU_ACCESS_FLAG_LAST),
       CVar2 == CPU_ACCESS_NONE)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_210 = (_func_int **)0xe30c4c;
      }
      else {
        local_210 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_f0 = local_210;
      LogError<true,char[24],char_const*,char[15],char[146]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x77,(char (*) [24])"Description of buffer \'",(char **)&local_f0,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [146])
                 "Unified memory on this device does not support write access. Check the available access flags in the device caps before creating unified buffers."
                );
    }
    CVar2 = operator&(*(CPU_ACCESS_FLAGS *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 5)
                      ,CPU_ACCESS_READ);
    if ((CVar2 != CPU_ACCESS_NONE) &&
       (CVar2 = operator&(Features->ShaderResourceStaticArrays,CPU_ACCESS_READ),
       CVar2 == CPU_ACCESS_NONE)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_218 = (SparseResourceProperties *)0xe30c4c;
      }
      else {
        local_218 = (SparseResourceProperties *)(pDevice_local->super_IObject)._vptr_IObject;
      }
      SparseRes = local_218;
      LogError<true,char[24],char_const*,char[15],char[145]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x7d,(char (*) [24])"Description of buffer \'",(char **)&SparseRes,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [145])
                 "Unified memory on this device does not support read access. Check the available access flags in the device caps before creating unified buffers."
                );
    }
    break;
  case 5:
    lVar10 = (**(code **)(MemoryInfo->LocalMemory + 200))();
    local_100 = (char *)(lVar10 + 0x1a0);
    if (*(char *)(lStack_40 + 0x28) == '\0') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_220 = (_func_int **)0xe30c4c;
      }
      else {
        local_220 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_108 = local_220;
      LogError<true,char[24],char_const*,char[15],char[47]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x84,(char (*) [24])"Description of buffer \'",(char **)&local_108,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [47])"sparse buffer requires SparseResources feature");
    }
    if (*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 5) != '\0') {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_228 = (_func_int **)0xe30c4c;
      }
      else {
        local_228 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_110 = local_228;
      LogError<true,char[24],char_const*,char[15],char[52]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x85,(char (*) [24])"Description of buffer \'",(char **)&local_110,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [52])"sparse buffers can\'t have any CPU access flags set.");
    }
    Delimiter = local_100;
    if (*(_func_int ***)(local_100 + 8) < pDevice_local[1].super_IObject._vptr_IObject) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_230 = (_func_int **)0xe30c4c;
      }
      else {
        local_230 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_118 = local_230;
      Delimiter = (char *)0x86;
      LogError<true,char[24],char_const*,char[15],char[21],unsigned_long,char[42],unsigned_long,char[2]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x86,(char (*) [24])"Description of buffer \'",(char **)&local_118,
                 (char (*) [15])"\' is invalid: ",(char (*) [21])0xf4b487,
                 (unsigned_long *)(pDevice_local + 1),
                 (char (*) [42])") must not exceed the ResourceSpaceSize (",
                 (unsigned_long *)(local_100 + 8),(char (*) [2])0xf65f2d);
    }
    SVar7 = operator&(*(SPARSE_RESOURCE_CAP_FLAGS *)(local_100 + 0x10),
                      SPARSE_RESOURCE_CAP_FLAG_BUFFER);
    if (SVar7 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_238 = (_func_int **)0xe30c4c;
      }
      else {
        local_238 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_120 = local_238;
      Delimiter = (char *)0x87;
      LogError<true,char[24],char_const*,char[15],char[66]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x87,(char (*) [24])"Description of buffer \'",(char **)&local_120,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [66])"sparse buffer requires SPARSE_RESOURCE_CAP_FLAG_BUFFER capability")
      ;
    }
    BVar6 = BIND_VERTEX_BUFFER;
    MVar3 = operator&(*(MISC_BUFFER_FLAGS *)
                       ((long)&pDevice_local[2].super_IObject._vptr_IObject + 7),
                      MISC_BUFFER_FLAG_SPARSE_ALIASING);
    if (MVar3 != MISC_BUFFER_FLAG_NONE) {
      BVar6 = BIND_INDIRECT_DRAW_ARGS;
      SVar7 = operator&(*(SPARSE_RESOURCE_CAP_FLAGS *)(local_100 + 0x10),
                        SPARSE_RESOURCE_CAP_FLAG_ALIASED);
      if (SVar7 == SPARSE_RESOURCE_CAP_FLAG_NONE) {
        if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
          local_240 = (_func_int **)0xe30c4c;
        }
        else {
          local_240 = (pDevice_local->super_IObject)._vptr_IObject;
        }
        local_128 = local_240;
        BVar6 = 0xf4abb8;
        Delimiter = (char *)0x89;
        LogError<true,char[24],char_const*,char[15],char[91]>
                  (false,"ValidateBufferDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                   ,0x89,(char (*) [24])"Description of buffer \'",(char **)&local_128,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [91])
                   "MISC_BUFFER_FLAG_SPARSE_ALIASING flag requires SPARSE_RESOURCE_CAP_FLAG_ALIASED capability"
                  );
      }
    }
    BVar8 = *(BIND_FLAGS *)&pDevice_local[2].super_IObject._vptr_IObject;
    BVar6 = operator~((Diligent *)(ulong)*(uint *)(local_100 + 0x18),BVar6);
    BVar8 = operator&(BVar8,BVar6);
    if (BVar8 != BIND_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_250 = (_func_int **)0xe30c4c;
      }
      else {
        local_250 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_130 = local_250;
      BVar8 = *(BIND_FLAGS *)&pDevice_local[2].super_IObject._vptr_IObject;
      BVar6 = operator~((Diligent *)(ulong)*(uint *)(local_100 + 0x18),BVar6);
      BVar6 = operator&(BVar8,BVar6);
      GetBindFlagsString_abi_cxx11_(&local_150,(Diligent *)(ulong)BVar6,0xf64f1c,Delimiter);
      msg.field_2._M_local_buf[0xf] = '.';
      LogError<true,char[24],char_const*,char[15],char[62],std::__cxx11::string,char>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x8b,(char (*) [24])"Description of buffer \'",(char **)&local_130,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [62])"the following bind flags are not allowed for sparse buffers: ",
                 &local_150,msg.field_2._M_local_buf + 0xf);
      std::__cxx11::string::~string((string *)&local_150);
    }
    break;
  default:
    FormatString<char[14]>((string *)local_178,(char (*) [14])"Unknown usage");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ValidateBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
               ,0x90);
    std::__cxx11::string::~string((string *)local_178);
  }
  if ((*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 4) == '\x02') &&
     (UVar9 = LinuxMisc::CountOneBits((Uint64)pDevice_local[4].super_IObject._vptr_IObject),
     1 < UVar9)) {
    BVar6 = operator&(*(BIND_FLAGS *)&pDevice_local[2].super_IObject._vptr_IObject,
                      BIND_UNORDERED_ACCESS);
    local_269 = true;
    if (BVar6 == BIND_NONE) {
      local_269 = *(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 6) == '\x01';
    }
    local_179 = local_269;
    if (local_269 != false) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_278 = (_func_int **)0xe30c4c;
      }
      else {
        local_278 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_188 = local_278;
      LogError<true,char[24],char_const*,char[15],char[375]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0x9c,(char (*) [24])"Description of buffer \'",(char **)&local_188,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [375])
                 "USAGE_DYNAMIC buffers that use UAV flag or FORMATTED mode require internal backing resource. This resource is implicitly transitioned by the device context and thus can\'t be safely used in multiple contexts. Create DYNAMIC buffer without UAV flag and use UNDEFINED mode and copy the contents to USAGE_DEFAULT buffer with required flags, which can be shared between contexts."
                );
    }
  }
  if (*(char *)((long)&pDevice_local[2].super_IObject._vptr_IObject + 4) != '\x05') {
    lVar1._0_1_ = Features->TextureUAVExtendedFormats;
    lVar1._1_1_ = Features->ShaderFloat16;
    lVar1._2_1_ = Features->ResourceBuffer16BitAccess;
    lVar1._3_1_ = Features->UniformBuffer16BitAccess;
    lVar1._4_1_ = Features->ShaderInputOutput16;
    lVar1._5_1_ = Features->ShaderInt8;
    lVar1._6_1_ = Features->ResourceBuffer8BitAccess;
    lVar1._7_1_ = Features->UniformBuffer8BitAccess;
    if ((lVar1 != 0) &&
       (*(_func_int ***)&Features->TextureUAVExtendedFormats <
        pDevice_local[1].super_IObject._vptr_IObject)) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_280 = (_func_int **)0xe30c4c;
      }
      else {
        local_280 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_190 = local_280;
      LogError<true,char[24],char_const*,char[15],char[25],unsigned_long,char[48],unsigned_long,char[2]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0xa3,(char (*) [24])"Description of buffer \'",(char **)&local_190,
                 (char (*) [15])"\' is invalid: ",(char (*) [25])"non-sparse buffer size (",
                 (unsigned_long *)(pDevice_local + 1),
                 (char (*) [48])") must not exceed the maximum allocation size (",
                 (unsigned_long *)&Features->TextureUAVExtendedFormats,(char (*) [2])0xf65f2d);
    }
    MVar3 = operator&(*(MISC_BUFFER_FLAGS *)
                       ((long)&pDevice_local[2].super_IObject._vptr_IObject + 7),
                      MISC_BUFFER_FLAG_SPARSE_ALIASING);
    if (MVar3 != MISC_BUFFER_FLAG_NONE) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_288 = (_func_int **)0xe30c4c;
      }
      else {
        local_288 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_198 = local_288;
      LogError<true,char[24],char_const*,char[15],char[86]>
                (false,"ValidateBufferDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BufferBase.cpp"
                 ,0xa5,(char (*) [24])"Description of buffer \'",(char **)&local_198,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [86])
                 "MiscFlags must not have MISC_BUFFER_FLAG_SPARSE_ALIASING if usage is not USAGE_SPARSE"
                );
    }
  }
  return;
}

Assistant:

void ValidateBufferDesc(const BufferDesc& Desc, const IRenderDevice* pDevice) noexcept(false)
{
    const AdapterMemoryInfo& MemoryInfo = pDevice->GetAdapterInfo().Memory;
    const DeviceFeatures&    Features   = pDevice->GetDeviceInfo().Features;

    static_assert(BIND_FLAG_LAST == 0x800L, "Please update this function to handle the new bind flags");

    constexpr Uint32 AllowedBindFlags =
        BIND_VERTEX_BUFFER |
        BIND_INDEX_BUFFER |
        BIND_UNIFORM_BUFFER |
        BIND_SHADER_RESOURCE |
        BIND_STREAM_OUTPUT |
        BIND_UNORDERED_ACCESS |
        BIND_INDIRECT_DRAW_ARGS |
        BIND_RAY_TRACING;

    VERIFY_BUFFER((Desc.BindFlags & ~AllowedBindFlags) == 0, "the following bind flags are not allowed for a buffer: ", GetBindFlagsString(Desc.BindFlags & ~AllowedBindFlags, ", "), '.');

    if ((Desc.BindFlags & BIND_UNORDERED_ACCESS) ||
        (Desc.BindFlags & BIND_SHADER_RESOURCE))
    {
        VERIFY_BUFFER(Desc.Mode > BUFFER_MODE_UNDEFINED && Desc.Mode < BUFFER_MODE_NUM_MODES, GetBufferModeString(Desc.Mode), " is not a valid mode for a buffer created with BIND_SHADER_RESOURCE or BIND_UNORDERED_ACCESS flags.");
        if (Desc.Mode == BUFFER_MODE_FORMATTED)
            VERIFY_BUFFER(Features.FormattedBuffers, "the device does not support formatted buffers. Check the FormattedBuffers device feature.");

        if (Desc.Mode == BUFFER_MODE_STRUCTURED || Desc.Mode == BUFFER_MODE_FORMATTED)
        {
            VERIFY_BUFFER(Desc.ElementByteStride != 0, "element stride must not be zero for structured and formatted buffers.");
        }
        else if (Desc.Mode == BUFFER_MODE_RAW)
        {
            // Nothing needs to be done
        }
    }

    if ((Desc.BindFlags & BIND_RAY_TRACING) != 0)
        VERIFY_BUFFER(Features.RayTracing, "BIND_RAY_TRACING flag can't be used when RayTracing feature is not enabled.");

    if ((Desc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0)
    {
        VERIFY_BUFFER((pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT) != 0,
                      "BIND_INDIRECT_DRAW_ARGS flag can't be used when DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT capability is not supported");
    }

    switch (Desc.Usage)
    {
        case USAGE_IMMUTABLE:
        case USAGE_DEFAULT:
            VERIFY_BUFFER(Desc.CPUAccessFlags == CPU_ACCESS_NONE, "static and default buffers can't have any CPU access flags set.");
            break;

        case USAGE_DYNAMIC:
            VERIFY_BUFFER(Desc.CPUAccessFlags == CPU_ACCESS_WRITE, "dynamic buffers require CPU_ACCESS_WRITE flag.");
            break;

        case USAGE_STAGING:
            VERIFY_BUFFER(Desc.CPUAccessFlags == CPU_ACCESS_WRITE || Desc.CPUAccessFlags == CPU_ACCESS_READ,
                          "exactly one of CPU_ACCESS_WRITE or CPU_ACCESS_READ flags must be specified for a staging buffer.");
            VERIFY_BUFFER(Desc.BindFlags == BIND_NONE,
                          "staging buffers cannot be bound to any part of the graphics pipeline and can't have any bind flags set.");
            break;

        case USAGE_UNIFIED:
            VERIFY_BUFFER(MemoryInfo.UnifiedMemory != 0,
                          "Unified memory is not present on this device. Check the amount of available unified memory "
                          "in the device caps before creating unified buffers.");
            VERIFY_BUFFER(Desc.CPUAccessFlags != CPU_ACCESS_NONE,
                          "at least one of CPU_ACCESS_WRITE or CPU_ACCESS_READ flags must be specified for a unified buffer.");
            if (Desc.CPUAccessFlags & CPU_ACCESS_WRITE)
            {
                VERIFY_BUFFER(MemoryInfo.UnifiedMemoryCPUAccess & CPU_ACCESS_WRITE,
                              "Unified memory on this device does not support write access. Check the available access flags "
                              "in the device caps before creating unified buffers.");
            }
            if (Desc.CPUAccessFlags & CPU_ACCESS_READ)
            {
                VERIFY_BUFFER(MemoryInfo.UnifiedMemoryCPUAccess & CPU_ACCESS_READ,
                              "Unified memory on this device does not support read access. Check the available access flags "
                              "in the device caps before creating unified buffers.");
            }
            break;

        case USAGE_SPARSE:
        {
            const SparseResourceProperties& SparseRes = pDevice->GetAdapterInfo().SparseResources;
            VERIFY_BUFFER(Features.SparseResources, "sparse buffer requires SparseResources feature");
            VERIFY_BUFFER(Desc.CPUAccessFlags == CPU_ACCESS_NONE, "sparse buffers can't have any CPU access flags set.");
            VERIFY_BUFFER(Desc.Size <= SparseRes.ResourceSpaceSize, "sparse buffer size (", Desc.Size, ") must not exceed the ResourceSpaceSize (", SparseRes.ResourceSpaceSize, ")");
            VERIFY_BUFFER((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_BUFFER) != 0, "sparse buffer requires SPARSE_RESOURCE_CAP_FLAG_BUFFER capability");
            if ((Desc.MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING) != 0)
                VERIFY_BUFFER(SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_ALIASED, "MISC_BUFFER_FLAG_SPARSE_ALIASING flag requires SPARSE_RESOURCE_CAP_FLAG_ALIASED capability");
            VERIFY_BUFFER((Desc.BindFlags & ~SparseRes.BufferBindFlags) == 0,
                          "the following bind flags are not allowed for sparse buffers: ", GetBindFlagsString(Desc.BindFlags & ~SparseRes.BufferBindFlags, ", "), '.');
            break;
        }

        default:
            UNEXPECTED("Unknown usage");
    }


    if (Desc.Usage == USAGE_DYNAMIC && PlatformMisc::CountOneBits(Desc.ImmediateContextMask) > 1)
    {
        bool NeedsBackingResource = (Desc.BindFlags & BIND_UNORDERED_ACCESS) != 0 || Desc.Mode == BUFFER_MODE_FORMATTED;
        if (NeedsBackingResource)
        {
            LOG_BUFFER_ERROR_AND_THROW("USAGE_DYNAMIC buffers that use UAV flag or FORMATTED mode require internal backing resource. "
                                       "This resource is implicitly transitioned by the device context and thus can't be safely used in "
                                       "multiple contexts. Create DYNAMIC buffer without UAV flag and use UNDEFINED mode and copy the contents to USAGE_DEFAULT buffer "
                                       "with required flags, which can be shared between contexts.");
        }
    }

    if (Desc.Usage != USAGE_SPARSE)
    {
        VERIFY_BUFFER(MemoryInfo.MaxMemoryAllocation == 0 || Desc.Size <= MemoryInfo.MaxMemoryAllocation,
                      "non-sparse buffer size (", Desc.Size, ") must not exceed the maximum allocation size (", MemoryInfo.MaxMemoryAllocation, ")");
        VERIFY_BUFFER((Desc.MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING) == 0,
                      "MiscFlags must not have MISC_BUFFER_FLAG_SPARSE_ALIASING if usage is not USAGE_SPARSE");
    }
}